

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

char * cmdarg(errcxdef *ec,char ***argpp,int *ip,int argc,int ofs,_func_void_errcxdef_ptr *usagefn)

{
  int in_ECX;
  int *in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  code *in_R9;
  char *ret;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = (char *)(*(long *)*in_RSI + (long)in_R8D + 1);
  if (*local_30 == '\0') {
    *in_RDX = *in_RDX + 1;
    *in_RSI = *in_RSI + 8;
    if (*in_RDX < in_ECX) {
      local_38 = *(char **)*in_RSI;
    }
    else {
      local_38 = (char *)0x0;
    }
    local_30 = local_38;
  }
  if (((local_30 == (char *)0x0) || (*local_30 == '\0')) && (in_R9 != (code *)0x0)) {
    (*in_R9)(in_RDI);
  }
  return local_30;
}

Assistant:

char *cmdarg(errcxdef *ec, char ***argpp, int *ip, int argc, int ofs,
             void (*usagefn)(errcxdef *))
{
    char *ret;

    /* 
     *   check to see if the argument is appended directly to the option;
     *   if not, look at the next string 
     */
    ret = (**argpp) + ofs + 1;
    if (*ret == '\0')
    {
        /* 
         *   it's not part of this string - get the argument from the next
         *   string in the vector 
         */
        ++(*ip);
        ++(*argpp);
        ret = (*ip >= argc ? 0 : **argpp);
    }

    /* 
     *   if we didn't find the argument, it's an error - display usage if
     *   we have a valid usage callback
     */
    if ((ret == 0 || *ret == 0) && usagefn != 0)
        (*usagefn)(ec);

    return ret;
}